

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edge-coloring.cpp
# Opt level: O3

void __thiscall
msdfgen::edgeColoringSimple
          (msdfgen *this,Shape *shape,double angleThreshold,unsigned_long_long seed)

{
  pointer pEVar1;
  Shape *pSVar2;
  EdgeColor EVar3;
  EdgeColor EVar4;
  EdgeSegment *pEVar5;
  double *pdVar6;
  uint uVar7;
  EdgeHolder *this_00;
  int iVar8;
  EdgeColor EVar9;
  int iVar10;
  ulong uVar11;
  EdgeSegment **ppEVar12;
  int iVar13;
  int iVar14;
  EdgeHolder *pEVar15;
  int iVar16;
  EdgeHolder *pEVar17;
  vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_> *this_01;
  int m;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  double in_XMM1_Qa;
  double dVar18;
  Vector2 VVar19;
  int index;
  vector<int,_std::allocator<int>_> corners;
  EdgeSegment *parts [7];
  Shape *local_e8;
  EdgeColor aEStack_e0 [2];
  Vector2 local_d8;
  int *local_c8;
  iterator iStack_c0;
  int *local_b8;
  double local_a8;
  int local_a0;
  EdgeColor local_9c;
  Vector2 local_98;
  EdgeSegment *local_88;
  long lStack_80;
  EdgeSegment *local_78;
  double adStack_70 [2];
  Vector2 local_60;
  msdfgen *local_50;
  double local_48;
  Vector2 local_40;
  
  local_48 = sin(angleThreshold);
  local_c8 = (int *)0x0;
  iStack_c0._M_current = (int *)0x0;
  local_b8 = (int *)0x0;
  this_01 = *(vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_> **)this;
  local_e8 = shape;
  local_50 = this;
  if (this_01 != *(vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_> **)(this + 8))
  {
    do {
      if (iStack_c0._M_current != local_c8) {
        iStack_c0._M_current = local_c8;
      }
      pEVar15 = (this_01->
                super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>).
                _M_impl.super__Vector_impl_data._M_start;
      pEVar17 = (this_01->
                super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>).
                _M_impl.super__Vector_impl_data._M_finish;
      if (pEVar15 == pEVar17) {
LAB_0016406e:
        pEVar17 = (this_01->
                  super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        pSVar2 = local_e8;
        if (pEVar17 != pEVar15) {
          do {
            pEVar5 = EdgeHolder::operator->(pEVar17);
            pEVar5->color = WHITE;
            pEVar17 = pEVar17 + 1;
          } while (pEVar17 !=
                   (this_01->
                   super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>).
                   _M_impl.super__Vector_impl_data._M_finish);
        }
      }
      else {
        pEVar5 = EdgeHolder::operator->(pEVar17 + -1);
        (*pEVar5->_vptr_EdgeSegment[4])(0,pEVar5);
        local_98.x = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
        local_98.y = in_XMM1_Qa;
        aEStack_e0[1] = 0;
        for (pEVar15 = (this_01->
                       super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>
                       )._M_impl.super__Vector_impl_data._M_start; local_98.y = in_XMM1_Qa,
            pEVar15 !=
            (this_01->super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>)
            ._M_impl.super__Vector_impl_data._M_finish; pEVar15 = pEVar15 + 1) {
          VVar19 = Vector2::normalize(&local_98,false);
          dVar18 = VVar19.y;
          local_d8.x = VVar19.x;
          local_d8.y = dVar18;
          pEVar5 = EdgeHolder::operator->(pEVar15);
          (*pEVar5->_vptr_EdgeSegment[4])(0,pEVar5);
          local_40.y = dVar18;
          VVar19 = Vector2::normalize(&local_40,false);
          local_60.y = VVar19.y;
          local_60.x = VVar19.x;
          dVar18 = dotProduct(&local_d8,&local_60);
          in_XMM1_Qa = 0.0;
          if ((dVar18 <= 0.0) ||
             (dVar18 = crossProduct(&local_d8,&local_60), local_48 < ABS(dVar18))) {
            if (iStack_c0._M_current == local_b8) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&local_c8,iStack_c0,
                         (int *)(aEStack_e0 + 1));
            }
            else {
              *iStack_c0._M_current = aEStack_e0[1];
              iStack_c0._M_current = iStack_c0._M_current + 1;
            }
          }
          pEVar5 = EdgeHolder::operator->(pEVar15);
          (*pEVar5->_vptr_EdgeSegment[4])(0,pEVar5);
          local_98.x = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
          aEStack_e0[1] = aEStack_e0[1] + 1;
          local_98.y = in_XMM1_Qa;
        }
        if (local_c8 == iStack_c0._M_current) goto LAB_0016406e;
        if ((long)iStack_c0._M_current - (long)local_c8 == 4) {
          uVar11 = (ulong)local_e8 / 3;
          EVar3 = *(EdgeColor *)
                   (switchColor(msdfgen::EdgeColor&,unsigned_long_long&,msdfgen::EdgeColor)::start +
                   ((ulong)local_e8 % 3) * 4);
          local_d8.x = (double)CONCAT44(7,EVar3);
          if ((EVar3 == WHITE) || (EVar3 == BLACK)) {
            EVar9 = *(EdgeColor *)
                     (switchColor(msdfgen::EdgeColor&,unsigned_long_long&,msdfgen::EdgeColor)::start
                     + (ulong)(uint)((int)uVar11 + (int)(uVar11 / 3) * -3) * 4);
            local_d8.y = (double)CONCAT44(local_d8.y._4_4_,EVar9);
            local_e8 = (Shape *)((ulong)local_e8 / 9);
          }
          else {
            EVar4 = EVar3 << ((byte)uVar11 & 1) + 1;
            EVar4 = EVar4 >> 3 | EVar4;
            EVar9 = EVar4 & WHITE;
            local_d8.y = (double)(CONCAT44(local_d8.y._4_4_,EVar4) & 0xffffffff00000007);
            local_e8 = (Shape *)(uVar11 >> 1);
          }
          iVar13 = *local_c8;
          pEVar17 = (this_01->
                    super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          uVar11 = (long)pEVar15 - (long)pEVar17 >> 3;
          pSVar2 = local_e8;
          if (uVar11 < 3) {
            if (pEVar15 != pEVar17) {
              local_78 = (EdgeSegment *)0x0;
              adStack_70[0] = 0.0;
              local_88 = (EdgeSegment *)0x0;
              lStack_80 = 0;
              local_98.x = 0.0;
              local_98.y = 0.0;
              adStack_70[1] = 0.0;
              pEVar5 = EdgeHolder::operator->(pEVar17);
              (*pEVar5->_vptr_EdgeSegment[10])
                        (pEVar5,(long)&local_98 + (long)iVar13 * 0x18,&local_98.y + iVar13 * 3,
                         &local_88 + iVar13 * 3);
              pEVar1 = (this_01->
                       super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              if ((ulong)((long)(this_01->
                                super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pEVar1) < 9) {
                EVar4 = WHITE;
                pdVar6 = &local_98.y;
                ppEVar12 = &local_88;
                pEVar5 = (EdgeSegment *)local_98.x;
              }
              else {
                pEVar5 = EdgeHolder::operator->(pEVar1 + 1);
                (*pEVar5->_vptr_EdgeSegment[10])
                          (pEVar5,&local_98.x + (iVar13 * -3 + 3),&local_98.x + (iVar13 * -3 + 4),
                           &local_98.x + (iVar13 * -3 + 5));
                *(EdgeColor *)((long)local_98.y + 8) = EVar3;
                *(EdgeColor *)((long)local_98.x + 8) = EVar3;
                *(undefined4 *)(lStack_80 + 8) = 7;
                EVar3 = WHITE;
                pdVar6 = adStack_70;
                ppEVar12 = &local_78;
                pEVar5 = local_88;
                EVar4 = EVar9;
              }
              pEVar5->color = EVar3;
              *(EdgeColor *)((long)*pdVar6 + 8) = EVar4;
              (*ppEVar12)->color = EVar9;
              pEVar15 = (this_01->
                        super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              pEVar17 = (this_01->
                        super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>
                        )._M_impl.super__Vector_impl_data._M_finish;
              this_00 = pEVar15;
              if (pEVar17 != pEVar15) {
                do {
                  EdgeHolder::~EdgeHolder(this_00);
                  this_00 = this_00 + 1;
                } while (this_00 != pEVar17);
                (this_01->
                super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>).
                _M_impl.super__Vector_impl_data._M_finish = pEVar15;
                if ((EdgeSegment *)local_98.x == (EdgeSegment *)0x0) goto LAB_00164093;
              }
              pdVar6 = &local_98.y;
              pEVar5 = (EdgeSegment *)local_98.x;
              do {
                EdgeHolder::EdgeHolder((EdgeHolder *)&local_60,pEVar5);
                std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>::
                emplace_back<msdfgen::EdgeHolder>(this_01,(EdgeHolder *)&local_60);
                EdgeHolder::~EdgeHolder((EdgeHolder *)&local_60);
                pEVar5 = (EdgeSegment *)*pdVar6;
                pdVar6 = pdVar6 + 1;
              } while (pEVar5 != (EdgeSegment *)0x0);
            }
          }
          else {
            iVar16 = (int)uVar11;
            if (0 < iVar16) {
              local_a8 = (double)(iVar16 + -1);
              iVar14 = 0;
              do {
                EVar3 = aEStack_e0[(int)(((double)iVar14 * 2.875) / local_a8 + 3.0 + -1.4375 + 0.5)]
                ;
                pEVar5 = EdgeHolder::operator->
                                   ((this_01->
                                    super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>
                                    )._M_impl.super__Vector_impl_data._M_start +
                                    (iVar13 + iVar14) % iVar16);
                pEVar5->color = EVar3;
                iVar14 = iVar14 + 1;
              } while (iVar16 != iVar14);
            }
          }
        }
        else {
          uVar11 = (ulong)((long)pEVar15 -
                          (long)(this_01->
                                super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3;
          iVar13 = (int)uVar11;
          pSVar2 = (Shape *)((ulong)local_e8 / 3);
          if (0 < iVar13) {
            local_a8 = (double)((ulong)((long)iStack_c0._M_current - (long)local_c8) >> 2);
            iVar16 = *local_c8;
            EVar3 = *(EdgeColor *)
                     (switchColor(msdfgen::EdgeColor&,unsigned_long_long&,msdfgen::EdgeColor)::start
                     + ((ulong)local_e8 % 3) * 4);
            local_a0 = SUB84(local_a8,0) + -2;
            iVar14 = 0;
            uVar11 = uVar11 & 0xffffffff;
            local_e8 = (Shape *)((ulong)local_e8 / 3);
            local_9c = EVar3;
            do {
              iVar10 = iVar16 % iVar13;
              iVar8 = iVar14 + 1;
              if ((iVar8 < SUB84(local_a8,0)) && (local_c8[iVar8] == iVar10)) {
                EVar9 = BLACK;
                if (iVar14 == local_a0) {
                  EVar9 = local_9c;
                }
                EVar9 = EVar9 & EVar3;
                iVar14 = iVar8;
                if ((EVar9 < MAGENTA) && ((0x16U >> (EVar9 & 0x1f) & 1) != 0)) {
                  EVar3 = EVar9 ^ WHITE;
                }
                else if ((EVar3 == WHITE) || (EVar3 == BLACK)) {
                  EVar3 = *(EdgeColor *)
                           (switchColor(msdfgen::EdgeColor&,unsigned_long_long&,msdfgen::EdgeColor)
                            ::start + ((ulong)local_e8 % 3) * 4);
                  local_e8 = (Shape *)((ulong)local_e8 / 3);
                }
                else {
                  EVar3 = EVar3 << ((byte)local_e8 & 1) + 1;
                  EVar3 = (EVar3 >> 3 | EVar3) & WHITE;
                  local_e8 = (Shape *)((ulong)local_e8 >> 1);
                }
              }
              pEVar5 = EdgeHolder::operator->
                                 ((this_01->
                                  super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>
                                  )._M_impl.super__Vector_impl_data._M_start + iVar10);
              pEVar5->color = EVar3;
              iVar16 = iVar16 + 1;
              uVar7 = (int)uVar11 - 1;
              uVar11 = (ulong)uVar7;
              pSVar2 = local_e8;
            } while (uVar7 != 0);
          }
        }
      }
LAB_00164093:
      local_e8 = pSVar2;
      this_01 = this_01 + 1;
    } while (this_01 !=
             *(vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_> **)(local_50 + 8));
    if (local_c8 != (int *)0x0) {
      operator_delete(local_c8);
    }
  }
  return;
}

Assistant:

void edgeColoringSimple(Shape &shape, double angleThreshold, unsigned long long seed) {
    double crossThreshold = sin(angleThreshold);
    std::vector<int> corners;
    for (std::vector<Contour>::iterator contour = shape.contours.begin(); contour != shape.contours.end(); ++contour) {
        // Identify corners
        corners.clear();
        if (!contour->edges.empty()) {
            Vector2 prevDirection = (*(contour->edges.end()-1))->direction(1);
            int index = 0;
            for (std::vector<EdgeHolder>::const_iterator edge = contour->edges.begin(); edge != contour->edges.end(); ++edge, ++index) {
                if (isCorner(prevDirection.normalize(), (*edge)->direction(0).normalize(), crossThreshold))
                    corners.push_back(index);
                prevDirection = (*edge)->direction(1);
            }
        }

        // Smooth contour
        if (corners.empty())
            for (std::vector<EdgeHolder>::iterator edge = contour->edges.begin(); edge != contour->edges.end(); ++edge)
                (*edge)->color = WHITE;
        // "Teardrop" case
        else if (corners.size() == 1) {
            EdgeColor colors[3] = { WHITE, WHITE };
            switchColor(colors[0], seed);
            switchColor(colors[2] = colors[0], seed);
            int corner = corners[0];
            if (contour->edges.size() >= 3) {
                int m = contour->edges.size();
                for (int i = 0; i < m; ++i)
                    contour->edges[(corner+i)%m]->color = (colors+1)[int(3+2.875*i/(m-1)-1.4375+.5)-3];
            } else if (contour->edges.size() >= 1) {
                // Less than three edge segments for three colors => edges must be split
                EdgeSegment *parts[7] = { };
                contour->edges[0]->splitInThirds(parts[0+3*corner], parts[1+3*corner], parts[2+3*corner]);
                if (contour->edges.size() >= 2) {
                    contour->edges[1]->splitInThirds(parts[3-3*corner], parts[4-3*corner], parts[5-3*corner]);
                    parts[0]->color = parts[1]->color = colors[0];
                    parts[2]->color = parts[3]->color = colors[1];
                    parts[4]->color = parts[5]->color = colors[2];
                } else {
                    parts[0]->color = colors[0];
                    parts[1]->color = colors[1];
                    parts[2]->color = colors[2];
                }
                contour->edges.clear();
                for (int i = 0; parts[i]; ++i)
                    contour->edges.push_back(EdgeHolder(parts[i]));
            }
        }
        // Multiple corners
        else {
            int cornerCount = corners.size();
            int spline = 0;
            int start = corners[0];
            int m = contour->edges.size();
            EdgeColor color = WHITE;
            switchColor(color, seed);
            EdgeColor initialColor = color;
            for (int i = 0; i < m; ++i) {
                int index = (start+i)%m;
                if (spline+1 < cornerCount && corners[spline+1] == index) {
                    ++spline;
                    switchColor(color, seed, EdgeColor((spline == cornerCount-1)*initialColor));
                }
                contour->edges[index]->color = color;
            }
        }
    }
}